

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

char * bson_iter_code(bson_iter_t *iter,uint32_t *length)

{
  uint8_t *puVar1;
  int iVar2;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x54c,"bson_iter_code","iter");
    abort();
  }
  puVar1 = iter->raw;
  if (puVar1[iter->type] == '\r') {
    if (length != (uint32_t *)0x0) {
      iVar2 = 1;
      if (1 < *(int *)(puVar1 + iter->d1)) {
        iVar2 = *(int *)(puVar1 + iter->d1);
      }
      *length = iVar2 - 1;
    }
    return (char *)(puVar1 + iter->d2);
  }
  if (length != (uint32_t *)0x0) {
    *length = 0;
  }
  return (char *)0x0;
}

Assistant:

const char *
bson_iter_code (const bson_iter_t *iter, /* IN */
                uint32_t *length)        /* OUT */
{
   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_CODE) {
      if (length) {
         *length = bson_iter_utf8_len_unsafe (iter);
      }

      return (const char *) (iter->raw + iter->d2);
   }

   if (length) {
      *length = 0;
   }

   return NULL;
}